

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void render(size_t *width,size_t *height,
           vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> *buffer,float interocular)

{
  size_t sVar1;
  pointer pVVar2;
  Scene *this;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  undefined4 in_XMM0_Db;
  size_t left_width;
  size_t right_width;
  vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> right_buffer;
  vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> left_buffer;
  allocator_type local_a5;
  float local_a4;
  ulong local_a0;
  undefined8 local_98;
  size_t local_80;
  vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> local_78;
  vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_> local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_98 = (Scene *)CONCAT44(in_XMM0_Db,interocular);
  this = setup_scene();
  if (((float)local_98 != 0.0) || (NAN((float)local_98))) {
    uVar8 = *width >> 1;
    local_80 = *width - uVar8;
    local_a0 = uVar8;
    std::vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>::vector
              (&local_60,*height * uVar8,(allocator_type *)&local_78);
    std::vector<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>::vector
              (&local_78,uVar8 * *height,&local_a5);
    local_98._0_4_ = (float)local_98 * 0.5;
    local_48._0_4_ = (this->camera).position.x;
    local_48._4_4_ = (this->camera).position.y;
    local_a4 = (this->camera).position.z;
    uStack_40 = 0;
    (this->camera).position.x = (float)local_98 + (float)local_48;
    (this->camera).position.y = (float)local_48._4_4_ + 0.0;
    (this->camera).position.z = local_a4 + 0.0;
    Scene::render(this,&local_a0,height,&local_60);
    (this->camera).position.x = (float)local_48 - (float)local_98;
    (this->camera).position.y = (float)local_48._4_4_;
    (this->camera).position.z = local_a4;
    Scene::render(this,&local_80,height,&local_78);
    (this->camera).position.x = (float)local_48;
    (this->camera).position.y = (float)local_48._4_4_;
    (this->camera).position.z = local_a4;
    uVar8 = *height;
    if (uVar8 != 0) {
      lVar4 = 0;
      lVar5 = 0;
      uVar6 = 0;
      do {
        if (local_a0 != 0) {
          lVar3 = 0;
          uVar8 = local_a0;
          do {
            sVar1 = *width;
            pVVar2 = (buffer->super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            *(undefined4 *)((long)&pVVar2->z + lVar3 + sVar1 * lVar4) =
                 *(undefined4 *)
                  ((long)&(local_60.
                           super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>.
                           _M_impl.super__Vector_impl_data._M_start)->z + lVar3 + lVar5);
            *(undefined8 *)((long)&pVVar2->x + lVar3 + sVar1 * lVar4) =
                 *(undefined8 *)
                  ((long)&(local_60.
                           super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>.
                           _M_impl.super__Vector_impl_data._M_start)->x + lVar3 + lVar5);
            lVar3 = lVar3 + 0xc;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
          uVar8 = *height;
        }
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + local_a0 * 0xc;
        lVar4 = lVar4 + 0xc;
      } while (uVar6 < uVar8);
      if (uVar8 != 0) {
        lVar4 = 0;
        lVar5 = 0;
        uVar6 = 0;
        do {
          lVar3 = local_a0 * 0xc;
          lVar7 = lVar5;
          uVar9 = local_a0;
          if (local_a0 != 0) {
            do {
              sVar1 = *width;
              pVVar2 = (buffer->
                       super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              *(undefined4 *)((long)&pVVar2->z + lVar3 + sVar1 * lVar4) =
                   *(undefined4 *)
                    ((long)&(local_78.
                             super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>.
                             _M_impl.super__Vector_impl_data._M_start)->z + lVar7);
              *(undefined8 *)((long)&pVVar2->x + lVar3 + sVar1 * lVar4) =
                   *(undefined8 *)
                    ((long)&(local_78.
                             super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>.
                             _M_impl.super__Vector_impl_data._M_start)->x + lVar7);
              lVar7 = lVar7 + 0xc;
              lVar3 = lVar3 + 0xc;
              uVar9 = uVar9 - 1;
            } while (uVar9 != 0);
            uVar8 = *height;
          }
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + local_80 * 0xc;
          lVar4 = lVar4 + 0xc;
        } while (uVar6 < uVar8);
      }
    }
    local_98 = this;
    if (local_78.super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    this = local_98;
    if (local_60.super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.
                      super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_60.
                            super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.
                            super__Vector_base<Vec<3UL,_float>,_std::allocator<Vec<3UL,_float>_>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    Scene::render(this,width,height,buffer);
  }
  Scene::~Scene(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

void render(const size_t &width, const size_t &height, std::vector<Vec3f> &buffer, const float interocular = 0) {
    Scene *scene = setup_scene();

    // Render a side-by-side 3d rendering if the interocular distance is nonzero.
    if (interocular == 0) {
        scene->render(width, height, buffer);
    } else {
        // Use two buffers in case of odd resolutions.
        const size_t left_width = width / 2;
        const size_t right_width = width - left_width;
        std::vector<Vec3f> left_buffer(left_width * height);
        std::vector<Vec3f> right_buffer(left_width * height);

        Vec3f eye_transformation(interocular / 2, 0, 0);
        Pos3f orig_cam_pos = scene->camera.position;

        // Render the left eye.
        scene->camera.position = orig_cam_pos + eye_transformation;
        scene->render(left_width, height, left_buffer);

        // Now the right.
        scene->camera.position = orig_cam_pos - eye_transformation;
        scene->render(right_width, height, right_buffer);

        // Don't forget to reset the camera position.
        scene->camera.position = orig_cam_pos;

        // Stitch the views together into the output buffer.
        for (size_t j = 0; j < height; j++) {
            for (size_t i = 0; i < left_width; i++) {
                buffer[i + j * width] = left_buffer[i + j * left_width];
            }
        }
        for (size_t j = 0; j < height; j++) {
            for (size_t i = 0; i < left_width; i++) {
                buffer[i + left_width + j * width] = right_buffer[i + j * right_width];
            }
        }
    }

    delete scene;
}